

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

ArgIface * __thiscall Args::Arg::findArgument(Arg *this,String *name)

{
  bool bVar1;
  ulong in_RSI;
  ArgIface *in_RDI;
  undefined5 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  byte bVar2;
  byte local_62;
  string local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_38 [32];
  ulong local_18;
  ArgIface *local_8;
  
  local_18 = in_RSI;
  bVar1 = details::isArgument((String *)0x13d092);
  local_62 = 0;
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_38,local_18);
    local_62 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string(local_38);
  }
  local_8 = in_RDI;
  if ((local_62 & 1) == 0) {
    bVar1 = details::isFlag((String *)
                            CONCAT17(local_62,CONCAT16(in_stack_ffffffffffffff8e,
                                                       CONCAT15(in_stack_ffffffffffffff8d,
                                                                in_stack_ffffffffffffff88))));
    bVar2 = 0;
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_60,local_18);
      bVar2 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string(local_60);
    }
    if ((bVar2 & 1) == 0) {
      local_8 = (ArgIface *)0x0;
    }
  }
  return local_8;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name ) override
	{
		if( details::isArgument( name ) && name.substr( 2 ) == m_name )
			return this;
		else if( details::isFlag( name ) && name.substr( 1 ) == m_flag )
			return this;
		else
			return nullptr;
	}